

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

sg_pass sg_make_pass(sg_pass_desc *desc)

{
  sg_image sVar1;
  sg_pass pass_id;
  _sg_pass_t *pass;
  long lVar2;
  sg_pass_desc *psVar3;
  sg_pass_desc desc_def;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f4e,"sg_pass sg_make_pass(const sg_pass_desc *)");
  }
  if (desc == (sg_pass_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f4f,"sg_pass sg_make_pass(const sg_pass_desc *)");
  }
  psVar3 = &desc_def;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    sVar1.id = desc->color_attachments[0].image.id;
    psVar3->_start_canary = desc->_start_canary;
    psVar3->color_attachments[0].image = (sg_image)sVar1.id;
    desc = (sg_pass_desc *)&desc->color_attachments[0].mip_level;
    psVar3 = (sg_pass_desc *)&psVar3->color_attachments[0].mip_level;
  }
  pass_id = _sg_alloc_pass();
  if (pass_id.id == 0) {
    _sg_log("pass pool exhausted!");
  }
  else {
    pass = _sg_pass_at(&_sg.pools,pass_id.id);
    if ((pass->slot).state != SG_RESOURCESTATE_ALLOC) {
      __assert_fail("pass && (pass->slot.state == SG_RESOURCESTATE_ALLOC)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f54,"sg_pass sg_make_pass(const sg_pass_desc *)");
    }
    _sg_init_pass(pass,&desc_def);
    if (((pass->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
      __assert_fail("(pass->slot.state == SG_RESOURCESTATE_VALID) || (pass->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f56,"sg_pass sg_make_pass(const sg_pass_desc *)");
    }
  }
  return (sg_pass)pass_id.id;
}

Assistant:

inline sg_pass sg_make_pass(const sg_pass_desc& desc) { return sg_make_pass(&desc); }